

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

err_t fileWrite(size_t *written,void *buf,size_t count,file_t file)

{
  size_t sVar1;
  FILE *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  size_t *in_RDI;
  undefined4 local_4;
  
  sVar1 = fwrite(in_RSI,1,in_RDX,in_RCX);
  *in_RDI = sVar1;
  if (*in_RDI == in_RDX) {
    local_4 = 0;
  }
  else {
    local_4 = 0xce;
  }
  return local_4;
}

Assistant:

err_t fileWrite(size_t* written, const void* buf, size_t count, file_t file)
{
	ASSERT(memIsValid(buf, count));
	ASSERT(fileIsValid(file));
	ASSERT(memIsValid(written, O_PER_S));
	*written = fwrite(buf, 1, count, file);
	if (*written != count)
		return ERR_FILE_WRITE;
	return ERR_OK;
}